

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O2

void ngram_fwdflat_allocate_1ph(ngram_search_t *ngs)

{
  short sVar1;
  uint uVar2;
  dict_t *pdVar3;
  dictword_t *pdVar4;
  bin_mdef_t *pbVar5;
  mdef_entry_t *pmVar6;
  ulong uVar7;
  int32 *piVar8;
  root_chan_t *prVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  pdVar3 = (ngs->base).dict;
  uVar2 = (ngs->base).n_words;
  ngs->n_1ph_words = 0;
  uVar7 = 0;
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar11 = uVar7;
  }
  iVar10 = 0;
  for (; uVar11 << 5 != uVar7; uVar7 = uVar7 + 0x20) {
    if (*(int *)((long)&pdVar3->word->pronlen + uVar7) == 1) {
      iVar10 = iVar10 + 1;
      ngs->n_1ph_words = iVar10;
    }
  }
  piVar8 = (int32 *)__ckd_calloc__((long)iVar10,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                                   ,0x66);
  ngs->single_phone_wid = piVar8;
  prVar9 = (root_chan_t *)
           __ckd_calloc__((long)ngs->n_1ph_words,0x70,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                          ,0x67);
  ngs->rhmm_1ph = prVar9;
  lVar12 = 0x10;
  iVar10 = 0;
  for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
    pdVar4 = pdVar3->word;
    if (*(int *)((long)&pdVar4->word + lVar12) == 1) {
      sVar1 = **(short **)((long)pdVar4 + lVar12 + -8);
      prVar9 = ngs->rhmm_1ph;
      prVar9[iVar10].ciphone = sVar1;
      pbVar5 = ((ngs->base).acmod)->mdef;
      prVar9[iVar10].ci2phone = (int16)pbVar5->sil;
      pmVar6 = pbVar5->phone;
      hmm_init(ngs->hmmctx,&prVar9[iVar10].hmm,1,pmVar6[sVar1].ssid,pmVar6[sVar1].tmat);
      prVar9 = ngs->rhmm_1ph;
      prVar9[iVar10].next = (chan_t *)0x0;
      ngs->word_chan[uVar7] = (chan_t *)(prVar9 + iVar10);
      ngs->single_phone_wid[iVar10] = (int32)uVar7;
      iVar10 = iVar10 + 1;
    }
    lVar12 = lVar12 + 0x20;
  }
  return;
}

Assistant:

static void
ngram_fwdflat_allocate_1ph(ngram_search_t *ngs)
{
    dict_t *dict = ps_search_dict(ngs);
    int n_words = ps_search_n_words(ngs);
    int i, w;

    /* Allocate single-phone words, since they won't have
     * been allocated for us by fwdtree initialization. */
    ngs->n_1ph_words = 0;
    for (w = 0; w < n_words; w++) {
        if (dict_is_single_phone(dict, w))
            ++ngs->n_1ph_words;
    }
    ngs->single_phone_wid = ckd_calloc(ngs->n_1ph_words,
                                       sizeof(*ngs->single_phone_wid));
    ngs->rhmm_1ph = ckd_calloc(ngs->n_1ph_words, sizeof(*ngs->rhmm_1ph));
    i = 0;
    for (w = 0; w < n_words; w++) {
        if (!dict_is_single_phone(dict, w))
            continue;

        /* DICT2PID location */
        ngs->rhmm_1ph[i].ciphone = dict_first_phone(dict, w);
        ngs->rhmm_1ph[i].ci2phone = bin_mdef_silphone(ps_search_acmod(ngs)->mdef);
        hmm_init(ngs->hmmctx, &ngs->rhmm_1ph[i].hmm, TRUE,
                 /* ssid */ bin_mdef_pid2ssid(ps_search_acmod(ngs)->mdef,
                                              ngs->rhmm_1ph[i].ciphone),
                 /* tmatid */ bin_mdef_pid2tmatid(ps_search_acmod(ngs)->mdef,
    						  ngs->rhmm_1ph[i].ciphone));
        ngs->rhmm_1ph[i].next = NULL;
        ngs->word_chan[w] = (chan_t *) &(ngs->rhmm_1ph[i]);
        ngs->single_phone_wid[i] = w;
        i++;
    }
}